

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::SocketStream::read(SocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  size_t size_local;
  char *ptr_local;
  SocketStream *this_local;
  
  iVar1 = detail::select_read(this->sock_,this->read_timeout_sec_,this->read_timeout_usec_);
  if (iVar1 < 1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    sVar2 = recv(this->sock_,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf,0);
    this_local._4_4_ = (uint)sVar2;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

inline int SocketStream::read(char *ptr, size_t size) {
  if (detail::select_read(sock_, read_timeout_sec_, read_timeout_usec_) > 0) {
    return recv(sock_, ptr, static_cast<int>(size), 0);
  }
  return -1;
}